

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

Literal __thiscall
Clasp::Solver::popVars(Solver *this,uint32 num,bool popLearnt,ConstraintDB *popAux)

{
  Constraint *pCVar1;
  unary_negate<std::binder2nd<std::less<Clasp::Literal>_>_> __pred;
  size_type n_00;
  iterator pIVar2;
  bool bVar3;
  ValueRep VVar4;
  uint32 uVar5;
  int iVar6;
  Literal LVar7;
  Var VVar8;
  iterator pIVar9;
  uint *puVar10;
  reference pLVar11;
  reference ppCVar12;
  undefined4 extraout_var;
  binder2nd<std::less<Clasp::Literal>_> bVar14;
  iterator last;
  DecisionHeuristic *pDVar15;
  uint uVar16;
  long in_RCX;
  byte in_DL;
  uint in_ESI;
  Solver *in_RDI;
  ClauseHead *c;
  LitVec cc;
  size_type end_2;
  size_type j_1;
  size_type i_1;
  uint32 n;
  uint32 endSimps;
  uint32 endFront;
  uint32 endUnits;
  uint32 end_1;
  uint32 i;
  uint32 nSimps;
  uint32 nFront;
  uint32 nUnits;
  uint32 j;
  Var end;
  Var v;
  iterator it;
  uint32 dl;
  Literal pop;
  Literal *in_stack_fffffffffffffe98;
  Solver *in_stack_fffffffffffffea0;
  Solver *this_00;
  less<Clasp::Literal> *in_stack_fffffffffffffea8;
  Solver *in_stack_fffffffffffffeb0;
  ConstraintDB *in_stack_fffffffffffffeb8;
  Solver *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  second_argument_type in_stack_fffffffffffffecc;
  binder2nd<std::less<Clasp::Literal>_> in_stack_fffffffffffffed0;
  uint32 in_stack_fffffffffffffedc;
  Solver *in_stack_fffffffffffffee0;
  ConstraintDB *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint uVar17;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> local_80;
  size_type local_70;
  size_type local_6c;
  size_type local_68;
  uint local_64;
  uint local_60;
  uint32 local_5c;
  uint32 local_58;
  uint32 local_54;
  uint32 local_50;
  uint local_4c;
  uint32 local_48;
  uint32 local_44;
  uint32 local_40;
  uint32 local_3c;
  Var local_38;
  Var local_34;
  iterator local_30;
  uint local_24;
  long local_20;
  byte local_15;
  uint local_14;
  Literal local_4;
  long *plVar13;
  
  local_15 = in_DL & 1;
  local_20 = in_RCX;
  local_14 = in_ESI;
  Assignment::numVars((Assignment *)0x1e67d5);
  local_4 = posLit(0x1e67e3);
  uVar5 = decisionLevel((Solver *)0x1e67f7);
  local_24 = uVar5 + 1;
  for (local_30 = ImpliedList::begin((ImpliedList *)0x1e6815); pIVar2 = local_30,
      pIVar9 = ImpliedList::end((ImpliedList *)0x1e6841), pIVar2 != pIVar9; local_30 = local_30 + 1)
  {
    bVar3 = operator<((Literal *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (!bVar3) {
      puVar10 = std::min<unsigned_int>(&local_24,&local_30->level);
      local_24 = *puVar10;
    }
  }
  local_34 = Literal::var(&local_4);
  local_38 = Literal::var(&local_4);
  local_38 = local_38 + local_14;
  for (; local_34 != local_38; local_34 = local_34 + 1) {
    VVar4 = value(in_stack_fffffffffffffea0,(Var)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    if (VVar4 != '\0') {
      local_3c = level(in_stack_fffffffffffffea0,(Var)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      puVar10 = std::min<unsigned_int>(&local_24,&local_3c);
      local_24 = *puVar10;
    }
  }
  uVar17 = local_24;
  uVar5 = rootLevel(in_RDI);
  if (uVar5 < uVar17) {
    undoUntil(in_stack_fffffffffffffeb0,(uint32)((ulong)in_stack_fffffffffffffea8 >> 0x20),
              (uint32)in_stack_fffffffffffffea8);
  }
  else {
    rootLevel(in_RDI);
    popRootLevel(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                 (LitVec *)in_stack_fffffffffffffed0,SUB41(in_stack_fffffffffffffecc.rep_ >> 0x18,0)
                );
    if (local_24 == 0) {
      local_40 = SharedContext::numUnary(in_RDI->shared_);
      local_44 = Assignment::units(&in_RDI->assign_);
      local_48 = (in_RDI->assign_).front;
      local_4c = *(uint *)&in_RDI->field_0x204 & 0x3fffffff;
      local_50 = local_40;
      local_54 = sizeVec<bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>>
                           ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1e6a4a)
      ;
      local_58 = local_44;
      local_5c = local_48;
      local_60 = *(uint *)&in_RDI->field_0x204 & 0x3fffffff;
      for (; local_50 != local_54; local_50 = local_50 + 1) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                  (&(in_RDI->assign_).trail,local_50);
        bVar3 = operator<((Literal *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        if (bVar3) {
          in_stack_ffffffffffffff28 =
               (ConstraintDB *)
               bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         (&(in_RDI->assign_).trail,local_50);
          uVar5 = local_40;
          local_40 = local_40 + 1;
          pLVar11 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                              (&(in_RDI->assign_).trail,uVar5);
          pLVar11->rep_ = *(uint32 *)&(in_stack_ffffffffffffff28->ebo_).buf;
        }
        else {
          local_44 = local_44 - (local_50 < local_58);
          local_48 = local_48 - (local_50 < local_5c);
          local_4c = local_4c - (local_50 < local_60);
        }
      }
      shrinkVecTo<bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>>
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                 in_stack_fffffffffffffeb0,(size_type)((ulong)in_stack_fffffffffffffea8 >> 0x20));
      (in_RDI->assign_).front = local_48;
      Assignment::setUnits(&in_RDI->assign_,local_44);
      *(uint *)&in_RDI->field_0x204 =
           *(uint *)&in_RDI->field_0x204 & 0xc0000000 | local_4c & 0x3fffffff;
    }
  }
  local_64 = local_14;
  while( true ) {
    VVar8 = (Var)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    uVar16 = local_64 - 1;
    if (local_64 == 0) break;
    local_64 = uVar16;
    bk_lib::
    pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
    ::back(&in_RDI->watches_);
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::clear
              ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)in_stack_fffffffffffffea0,
               SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
    bk_lib::
    pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
    ::pop_back(&in_RDI->watches_);
    bk_lib::
    pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
    ::back(&in_RDI->watches_);
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::clear
              ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)in_stack_fffffffffffffea0,
               SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
    bk_lib::
    pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
    ::pop_back(&in_RDI->watches_);
  }
  local_64 = uVar16;
  if ((local_15 & 1) != 0) {
    SharedContext::report
              ((SharedContext *)in_stack_fffffffffffffed0,
               (char *)CONCAT44(in_stack_fffffffffffffecc.rep_,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
    local_70 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                         (&in_RDI->learnts_);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               in_stack_fffffffffffffec0);
    local_6c = 0;
    for (local_68 = 0; VVar8 = (Var)((ulong)in_stack_fffffffffffffe98 >> 0x20), local_68 != local_70
        ; local_68 = local_68 + 1) {
      ppCVar12 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                 operator[](&in_RDI->learnts_,local_68);
      n_00 = local_6c;
      pCVar1 = *ppCVar12;
      local_6c = local_6c + 1;
      ppCVar12 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                 operator[](&in_RDI->learnts_,n_00);
      *ppCVar12 = pCVar1;
      ppCVar12 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                 operator[](&in_RDI->learnts_,local_68);
      iVar6 = (*(*ppCVar12)->_vptr_Constraint[9])();
      plVar13 = (long *)CONCAT44(extraout_var,iVar6);
      if ((plVar13 != (long *)0x0) && (bVar3 = ClauseHead::aux((ClauseHead *)0x1e6e03), bVar3)) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear(&local_80);
        (**(code **)(*plVar13 + 0xa0))(plVar13,&local_80);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin(&local_80);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(&local_80);
        std::bind2nd<std::less<Clasp::Literal>,Clasp::Literal>
                  (in_stack_fffffffffffffea8,(Literal *)in_stack_fffffffffffffea0);
        std::not1<std::binder2nd<std::less<Clasp::Literal>>>
                  ((binder2nd<std::less<Clasp::Literal>_> *)0x1e6ea1);
        __pred._M_pred = in_stack_fffffffffffffed0;
        __pred._0_4_ = in_stack_fffffffffffffecc.rep_;
        in_stack_fffffffffffffed0 =
             (binder2nd<std::less<Clasp::Literal>_>)
             std::
             find_if<Clasp::Literal*,std::unary_negate<std::binder2nd<std::less<Clasp::Literal>>>>
                       ((Literal *)in_stack_fffffffffffffec0,(Literal *)in_stack_fffffffffffffeb8,
                        __pred);
        bVar14 = (binder2nd<std::less<Clasp::Literal>_>)
                 bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(&local_80)
        ;
        in_stack_fffffffffffffecc = bVar14.value.rep_;
        if (in_stack_fffffffffffffed0 != bVar14) {
          (**(code **)(*plVar13 + 0x28))(plVar13,in_RDI,1);
          local_6c = local_6c - 1;
        }
      }
    }
    in_stack_fffffffffffffeb8 = &in_RDI->learnts_;
    in_stack_fffffffffffffec0 =
         (Solver *)
         bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::begin
                   (in_stack_fffffffffffffeb8);
    last = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::end
                     (&in_RDI->learnts_);
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::erase
              ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
               in_stack_fffffffffffffec0,(iterator)in_stack_fffffffffffffeb8,last);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1e6fd8);
  }
  uVar5 = (uint32)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  if (local_20 != 0) {
    destroyDB((Solver *)CONCAT44(uVar17,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28);
  }
  this_00 = (Solver *)&in_RDI->assign_;
  Assignment::numVars((Assignment *)0x1e701a);
  Assignment::resize((Assignment *)in_stack_fffffffffffffec0,uVar5);
  Literal::var(&in_RDI->tag_);
  bVar3 = validVar(this_00,VVar8);
  if (!bVar3) {
    LVar7 = lit_true();
    (in_RDI->tag_).rep_ = LVar7.rep_;
  }
  pDVar15 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                      ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1e7088);
  VVar8 = Literal::var(&local_4);
  (*pDVar15->_vptr_DecisionHeuristic[6])(pDVar15,in_RDI,(ulong)VVar8,(ulong)local_14);
  return (Literal)local_4.rep_;
}

Assistant:

Literal Solver::popVars(uint32 num, bool popLearnt, ConstraintDB* popAux) {
	Literal pop = posLit(assign_.numVars() - num);
	uint32  dl  = decisionLevel() + 1;
	for (ImpliedList::iterator it = impliedLits_.begin(); it != impliedLits_.end(); ++it) {
		if (!(it->lit < pop)) { dl = std::min(dl, it->level); }
	}
	for (Var v = pop.var(), end = pop.var()+num; v != end; ++v) {
		if (value(v) != value_free) { dl = std::min(dl, level(v)); }
	}
	// 1. remove aux vars from assignment and watch lists
	if (dl > rootLevel()) {
		undoUntil(dl-1, undo_pop_proj_level);
	}
	else {
		popRootLevel((rootLevel() - dl) + 1);
		if (dl == 0) { // top-level has aux vars - cleanup manually
			uint32 j = shared_->numUnary();
			uint32 nUnits = assign_.units(), nFront = assign_.front, nSimps = lastSimp_;
			for (uint32 i = j, end = sizeVec(assign_.trail), endUnits = nUnits, endFront = nFront, endSimps = lastSimp_; i != end; ++i) {
				if (assign_.trail[i] < pop) { assign_.trail[j++] = assign_.trail[i]; }
				else {
					nUnits -= (i < endUnits);
					nFront -= (i < endFront);
					nSimps -= (i < endSimps);
				}
			}
			shrinkVecTo(assign_.trail, j);
			assign_.front = nFront;
			assign_.setUnits(nUnits);
			lastSimp_ = nSimps;
		}
	}
	for (uint32 n = num; n--;) {
		watches_.back().clear(true);
		watches_.pop_back();
		watches_.back().clear(true);
		watches_.pop_back();
	}
	// 2. remove learnt constraints over aux
	if (popLearnt) {
		shared_->report("removing aux constraints", this);
		ConstraintDB::size_type i, j, end = learnts_.size();
		LitVec cc;
		for (i = j = 0; i != end; ++i) {
			learnts_[j++] = learnts_[i];
			ClauseHead* c = learnts_[i]->clause();
			if (c && c->aux()) {
				cc.clear();
				c->toLits(cc);
				if (std::find_if(cc.begin(), cc.end(), std::not1(std::bind2nd(std::less<Literal>(), pop))) != cc.end()) {
					c->destroy(this, true);
					--j;
				}
			}
		}
		learnts_.erase(learnts_.begin()+j, learnts_.end());
	}
	if (popAux) { destroyDB(*popAux); }
	// 3. remove vars from solver and heuristic
	assign_.resize(assign_.numVars()-num);
	if (!validVar(tag_.var())) { tag_ = lit_true(); }
	heuristic_->updateVar(*this, pop.var(), num);
	return pop;
}